

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueBooleanCase::test
          (UniformValueBooleanCase *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  GLint GVar1;
  GLint GVar2;
  undefined8 in_R8;
  GLint GVar3;
  undefined8 in_R9;
  long lVar4;
  ShaderProgram program;
  ProgramSources sources;
  GLint w;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  value_type local_1f0;
  ShaderProgram local_1d0;
  ProgramSources local_100;
  
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             "uniform bool boolUniform;\nuniform bvec2 bool2Uniform;\nuniform bvec3 bool3Uniform;\nuniform bvec4 bool4Uniform;\nvoid main (void)\n{\n\tgl_Position = vec4(float(boolUniform) + float(bool2Uniform.x) + float(bool3Uniform.x) + float(bool4Uniform.x));\n}\n"
             ,"");
  _Var5._M_p = (pointer)&local_200;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffdf0,
             "void main (void)\n{\n\tgl_FragColor = vec4(0.0);\n}\n","");
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,(value_type *)&stack0xfffffffffffffdf0);
  glu::ShaderProgram::ShaderProgram(&local_1d0,renderCtx,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    GVar3 = (GLint)in_R9;
    GVar2 = (GLint)in_R8;
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != &local_200) {
    operator_delete(_Var5._M_p,local_200._M_allocated_capacity + 1);
  }
  w = (GLint)_Var5._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&local_1d0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,local_1d0.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"boolUniform");
    glu::CallLogWrapper::glUniform1i(this_00,GVar1,1);
    verifyUniformValue1i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar1,GVar2);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"bool2Uniform");
    glu::CallLogWrapper::glUniform2i(this_00,GVar2,1,2);
    verifyUniformValue2i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar2,1,GVar3);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"bool3Uniform");
    glu::CallLogWrapper::glUniform3i(this_00,GVar2,0,1,2);
    verifyUniformValue3i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar2,0,1,1);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"bool4Uniform");
    glu::CallLogWrapper::glUniform4i(this_00,GVar2,1,0,1,-1);
    GVar3 = 0;
    GVar1 = 1;
    verifyUniformValue4i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar2,0,1,1,w);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"boolUniform");
    glu::CallLogWrapper::glUniform1f(this_00,GVar2,1.0);
    verifyUniformValue1i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar2,GVar3);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"bool2Uniform");
    glu::CallLogWrapper::glUniform2f(this_00,GVar2,1.0,0.1);
    verifyUniformValue2i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar2,1,GVar1);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"bool3Uniform");
    glu::CallLogWrapper::glUniform3f(this_00,GVar2,0.0,0.1,-0.1);
    verifyUniformValue3i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar2,0,1,1);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"bool4Uniform");
    glu::CallLogWrapper::glUniform4f(this_00,GVar2,1.0,0.0,0.1,-0.9);
    verifyUniformValue4i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar2,0,1,1,w);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&local_1d0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform bool boolUniform;\n"
			"uniform bvec2 bool2Uniform;\n"
			"uniform bvec3 bool3Uniform;\n"
			"uniform bvec4 bool4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(float(boolUniform) + float(bool2Uniform.x) + float(bool3Uniform.x) + float(bool4Uniform.x));\n"
			"}\n";
		static const char* testFragSource =
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		// int conversion

		location = glGetUniformLocation(program.getProgram(), "boolUniform");
		glUniform1i(location, 1);
		verifyUniformValue1i(m_testCtx, *this, program.getProgram(), location, 1);

		location = glGetUniformLocation(program.getProgram(), "bool2Uniform");
		glUniform2i(location, 1, 2);
		verifyUniformValue2i(m_testCtx, *this, program.getProgram(), location, 1, 1);

		location = glGetUniformLocation(program.getProgram(), "bool3Uniform");
		glUniform3i(location, 0, 1, 2);
		verifyUniformValue3i(m_testCtx, *this, program.getProgram(), location, 0, 1, 1);

		location = glGetUniformLocation(program.getProgram(), "bool4Uniform");
		glUniform4i(location, 1, 0, 1, -1);
		verifyUniformValue4i(m_testCtx, *this, program.getProgram(), location, 1, 0, 1, 1);

		// float conversion

		location = glGetUniformLocation(program.getProgram(), "boolUniform");
		glUniform1f(location, 1.0f);
		verifyUniformValue1i(m_testCtx, *this, program.getProgram(), location, 1);

		location = glGetUniformLocation(program.getProgram(), "bool2Uniform");
		glUniform2f(location, 1.0f, 0.1f);
		verifyUniformValue2i(m_testCtx, *this, program.getProgram(), location, 1, 1);

		location = glGetUniformLocation(program.getProgram(), "bool3Uniform");
		glUniform3f(location, 0.0f, 0.1f, -0.1f);
		verifyUniformValue3i(m_testCtx, *this, program.getProgram(), location, 0, 1, 1);

		location = glGetUniformLocation(program.getProgram(), "bool4Uniform");
		glUniform4f(location, 1.0f, 0.0f, 0.1f, -0.9f);
		verifyUniformValue4i(m_testCtx, *this, program.getProgram(), location, 1, 0, 1, 1);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}